

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

ALLEGRO_FS_INTERFACE * al_get_fs_interface(void)

{
  long *plVar1;
  ALLEGRO_FS_INTERFACE *pAVar2;
  
  plVar1 = (long *)__tls_get_addr(&PTR_001d9500);
  if (*plVar1 == 0) {
    *plVar1 = (long)(plVar1 + 1);
    initialize_tls_values((thread_local_state *)(plVar1 + 1));
  }
  if ((*plVar1 == 0) ||
     (pAVar2 = *(ALLEGRO_FS_INTERFACE **)(*plVar1 + 0x118), pAVar2 == (ALLEGRO_FS_INTERFACE *)0x0))
  {
    pAVar2 = &_al_fs_interface_stdio;
  }
  return pAVar2;
}

Assistant:

const ALLEGRO_FS_INTERFACE *al_get_fs_interface(void)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return &_al_fs_interface_stdio;

   if (tls->fs_interface)
      return tls->fs_interface;
   else
      return &_al_fs_interface_stdio;
}